

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O0

value_type_conflict5 * __thiscall
poplar::compact_bonsai_nlm<int,_16UL>::insert
          (compact_bonsai_nlm<int,_16UL> *this,uint64_t pos,char_range *key)

{
  bool bVar1;
  type_conflict *ptVar2;
  type_conflict *ptVar3;
  reference x;
  uint64_t uVar4;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *puVar5;
  pointer puVar6;
  pointer dst;
  uint8_t *src;
  uint8_t *puVar7;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *puVar8;
  char_range *in_RDX;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  *in_RDI;
  pair<unsigned_long,_unsigned_long> pVar9;
  uint8_t *new_ptr;
  uint8_t *orig_ptr;
  __array new_unique;
  uint64_t new_alloc;
  uint64_t len;
  pair<unsigned_long,_unsigned_long> fr_alloc;
  value_type_conflict5 *ret_ptr;
  uint8_t *ptr;
  uint64_t new_alloc_1;
  uint64_t length;
  type_conflict *pos_in_chunk;
  type_conflict *chunk_id;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffff28;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffff30;
  uint64_t local_c8;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *in_stack_ffffffffffffff40;
  uint64_t in_stack_ffffffffffffff60;
  uint64_t in_stack_ffffffffffffff68;
  _Head_base<0UL,_unsigned_char_*,_false> in_stack_ffffffffffffff70;
  uint64_t local_78;
  uint64_t local_70;
  value_type_conflict5 *local_8;
  
  decompose_value<16ul>((uint64_t)in_stack_ffffffffffffff30);
  ptVar2 = std::get<0ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x19a496)
  ;
  ptVar3 = std::get<1ul,unsigned_long,unsigned_long>((pair<unsigned_long,_unsigned_long> *)0x19a4ab)
  ;
  x = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[]
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)(in_RDI + 1),*ptVar2);
  bit_tools::set_bit(x,*ptVar3,true);
  in_RDI[2].
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&((in_RDI[2].
                          super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t + 1);
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::operator[](in_RDI,*ptVar2);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)0x19a50d)
  ;
  if (bVar1) {
    pVar9 = get_allocs_((compact_bonsai_nlm<int,_16UL> *)in_stack_ffffffffffffff70._M_head_impl,
                        in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
    bVar1 = char_range::empty(in_RDX);
    if (bVar1) {
      local_c8 = 0;
    }
    else {
      local_c8 = char_range::length(in_RDX);
      local_c8 = local_c8 - 1;
    }
    uVar4 = vbyte::size(local_c8 + 4);
    in_RDI[2].
    super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((long)&((in_RDI[2].
                            super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                  uVar4 + 4 + local_c8);
    puVar5 = (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             &stack0xffffffffffffff70;
    std::make_unique<unsigned_char[]>((size_t)in_RDI);
    std::
    vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ::operator[](in_RDI,*ptVar2);
    puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get(puVar5);
    dst = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get(puVar5);
    local_78 = pVar9.first;
    copy_bytes(dst,puVar6,local_78);
    src = puVar6 + local_78;
    puVar7 = dst + local_78;
    puVar8 = (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             vbyte::encode(puVar7,local_c8 + 4);
    puVar7 = puVar7 + (long)puVar8;
    copy_bytes(puVar7,in_RDX->begin,local_c8);
    local_8 = (value_type_conflict5 *)(puVar7 + local_c8);
    *local_8 = 0;
    local_70 = pVar9.second;
    copy_bytes((uint8_t *)(local_8 + 1),src,local_70);
    std::
    vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ::operator[](in_RDI,*ptVar2);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
              (puVar5,puVar8);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
              (in_stack_ffffffffffffff40);
  }
  else {
    bVar1 = char_range::empty(in_RDX);
    if (bVar1) {
      puVar5 = (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)0x0;
    }
    else {
      uVar4 = char_range::length(in_RDX);
      puVar5 = (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)(uVar4 - 1);
    }
    puVar8 = puVar5;
    uVar4 = vbyte::size((uint64_t)
                        ((long)&(puVar5->_M_t).
                                super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + 4));
    in_RDI[2].
    super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((long)&((in_RDI[2].
                            super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish)->_M_t).
                          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                          .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl +
                  (long)&(puVar5->_M_t).
                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl + uVar4 + 4);
    std::make_unique<unsigned_char[]>((size_t)in_RDI);
    std::
    vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ::operator[](in_RDI,*ptVar2);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::operator=
              (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr(puVar8);
    std::
    vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
    ::operator[](in_RDI,*ptVar2);
    puVar6 = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                       (in_stack_ffffffffffffff30);
    uVar4 = vbyte::encode(puVar6,(uint64_t)
                                 ((long)&(puVar5->_M_t).
                                         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>
                                         .super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl
                                 + 4));
    copy_bytes(puVar6 + uVar4,in_RDX->begin,(uint64_t)puVar5);
    local_8 = (value_type_conflict5 *)(puVar6 + uVar4 + (long)puVar5);
    *local_8 = 0;
  }
  return local_8;
}

Assistant:

value_type* insert(uint64_t pos, const char_range& key) {
        auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(pos);

        assert(!bit_tools::get_bit(chunks_[chunk_id], pos_in_chunk));
        bit_tools::set_bit(chunks_[chunk_id], pos_in_chunk);

        ++size_;

#ifdef POPLAR_EXTRA_STATS
        max_length_ = std::max<uint64_t>(max_length_, key.length());
        sum_length_ += key.length();
#endif

        if (!ptrs_[chunk_id]) {
            // First association in the group
            uint64_t length = key.empty() ? 0 : key.length() - 1;
            uint64_t new_alloc = vbyte::size(length + sizeof(value_type)) + length + sizeof(value_type);
            label_bytes_ += new_alloc;

            ptrs_[chunk_id] = std::make_unique<uint8_t[]>(new_alloc);
            uint8_t* ptr = ptrs_[chunk_id].get();

            ptr += vbyte::encode(ptr, length + sizeof(value_type));
            copy_bytes(ptr, key.begin, length);

            auto ret_ptr = reinterpret_cast<value_type*>(ptr + length);
            *ret_ptr = static_cast<value_type>(0);

            return ret_ptr;
        }

        // Second and subsequent association in the group
        auto fr_alloc = get_allocs_(chunk_id, pos_in_chunk);

        const uint64_t len = key.empty() ? 0 : key.length() - 1;
        const uint64_t new_alloc = vbyte::size(len + sizeof(value_type)) + len + sizeof(value_type);
        label_bytes_ += new_alloc;

        auto new_unique = std::make_unique<uint8_t[]>(fr_alloc.first + new_alloc + fr_alloc.second);

        // Get raw pointers
        const uint8_t* orig_ptr = ptrs_[chunk_id].get();
        uint8_t* new_ptr = new_unique.get();

        // Copy the front allocation
        copy_bytes(new_ptr, orig_ptr, fr_alloc.first);
        orig_ptr += fr_alloc.first;
        new_ptr += fr_alloc.first;

        // Set new allocation
        new_ptr += vbyte::encode(new_ptr, len + sizeof(value_type));
        copy_bytes(new_ptr, key.begin, len);
        new_ptr += len;
        *reinterpret_cast<value_type*>(new_ptr) = static_cast<value_type>(0);

        // Copy the back allocation
        copy_bytes(new_ptr + sizeof(value_type), orig_ptr, fr_alloc.second);

        // Overwrite
        ptrs_[chunk_id] = std::move(new_unique);

        return reinterpret_cast<value_type*>(new_ptr);
    }